

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>
          (InternalMetadata *this,string *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  if ((this->ptr_ & 1U) == 0) {
    pbVar1 = mutable_unknown_fields_slow<std::__cxx11::string>(this);
  }
  else {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((this->ptr_ & 0xfffffffffffffffcU) + 8);
  }
  std::__cxx11::string::swap((string *)pbVar1);
  return;
}

Assistant:

void InternalMetadata::DoSwap<std::string>(std::string* other) {
  mutable_unknown_fields<std::string>()->swap(*other);
}